

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1fc67bb::BlendA64MaskTest8B_d16_ExtremeValues_Test::TestBody
          (BlendA64MaskTest8B_d16_ExtremeValues_Test *this)

{
  uchar *puVar1;
  unsigned_short *puVar2;
  bool bVar3;
  long lVar4;
  int bsize;
  int block_size;
  
  memset((this->super_BlendA64MaskTest8B_d16).
         super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
         .dst_ref_,0xff,0x28000);
  lVar4 = 0x14020;
  do {
    puVar1 = (this->super_BlendA64MaskTest8B_d16).
             super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
             .dst_ref_ + lVar4 * 2 + -0x38;
    puVar1[0] = 0xff;
    puVar1[1] = '?';
    puVar1[2] = 0xff;
    puVar1[3] = '?';
    puVar1[4] = 0xff;
    puVar1[5] = '?';
    puVar1[6] = 0xff;
    puVar1[7] = '?';
    puVar1[8] = 0xff;
    puVar1[9] = '?';
    puVar1[10] = 0xff;
    puVar1[0xb] = '?';
    puVar1[0xc] = 0xff;
    puVar1[0xd] = '?';
    puVar1[0xe] = 0xff;
    puVar1[0xf] = '?';
    puVar2 = (this->super_BlendA64MaskTest8B_d16).
             super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
             .src0_ + lVar4 + -0x1c;
    puVar2[0] = 0x3fff;
    puVar2[1] = 0x3fff;
    puVar2[2] = 0x3fff;
    puVar2[3] = 0x3fff;
    puVar2[4] = 0x3fff;
    puVar2[5] = 0x3fff;
    puVar2[6] = 0x3fff;
    puVar2[7] = 0x3fff;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x28020);
  memset((this->super_BlendA64MaskTest8B_d16).
         super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
         .mask_,0x3f,0x10000);
  block_size = 0;
  do {
    bVar3 = testing::Test::HasFatalFailure();
    if (bVar3) {
      return;
    }
    BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
    ::RunTest((BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
               *)this,block_size,1);
    block_size = block_size + 1;
  } while (block_size != 0x16);
  return;
}

Assistant:

TEST_P(BlendA64MaskTest8B_d16, ExtremeValues) {
  for (int i = 0; i < kBufSize; ++i) {
    dst_ref_[i] = 255;
    dst_tst_[i] = 255;

    src0_[i] = kSrcMaxBitsMask;
    src1_[i] = kSrcMaxBitsMask;
  }

  for (int i = 0; i < kMaxMaskSize; ++i) mask_[i] = AOM_BLEND_A64_MAX_ALPHA - 1;

  for (int bsize = 0; bsize < BLOCK_SIZES_ALL && !HasFatalFailure(); ++bsize)
    RunTest(bsize, 1);
}